

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateSurfaceTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::anon_unknown_4::CreateWindowSurfaceCase::executeForConfig
          (CreateWindowSurfaceCase *this,EGLDisplay display,EGLConfig config)

{
  bool bVar1;
  NativeDisplay *pNVar2;
  EGLint EVar3;
  deUint32 dVar4;
  int iVar5;
  Library *egl;
  NativeWindowFactory *pNVar6;
  NotSupportedError *this_00;
  undefined4 extraout_var;
  Library *egl_00;
  undefined8 uVar7;
  EGLSurface surface_00;
  undefined4 extraout_var_02;
  long *plVar8;
  char *platformExt;
  EGLint windowHeight;
  EGLint windowWidth;
  UniqueSurface surface;
  int local_1e8;
  int local_1e4;
  long *local_1e0;
  TestLog *local_1d8;
  EGLConfig local_1d0;
  UniqueSurface local_1c8;
  undefined1 local_1b0 [8];
  Visibility local_1a8;
  ios_base local_138 [264];
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  egl = EglTestContext::getLibrary((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  local_1d8 = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
              )->m_log;
  local_1d0 = config;
  EVar3 = eglu::getConfigID(egl,display,config);
  pNVar6 = eglu::selectNativeWindowFactory
                     (((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->
                      m_nativeDisplayFactory,
                      ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx)->m_cmdLine);
  if (this->m_useLegacyCreate == true) {
    if ((pNVar6->m_capabilities & CAPABILITY_CREATE_SURFACE_LEGACY) != 0) {
LAB_00e5dcf6:
      local_1b0 = (undefined1  [8])local_1d8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"Creating window surface with config ID ",0x27);
      std::ostream::operator<<((ostringstream *)&local_1a8,EVar3);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      dVar4 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar4,"init",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
                       ,0x89);
      pNVar2 = (((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->m_nativeDisplay).
               super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.
               m_data.ptr;
      local_1a8 = eglu::parseWindowVisibility
                            (((this->super_SimpleConfigCase).super_TestCase.super_TestCase.
                              super_TestNode.m_testCtx)->m_cmdLine);
      local_1b0 = (undefined1  [8])0x4000000040;
      iVar5 = (*(pNVar6->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                        (pNVar6,pNVar2,display,local_1d0,0,local_1b0);
      local_1e0 = (long *)CONCAT44(extraout_var,iVar5);
      pNVar2 = (((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->m_nativeDisplay).
               super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.
               m_data.ptr;
      bVar1 = this->m_useLegacyCreate;
      iVar5 = (*pNVar2->_vptr_NativeDisplay[2])(pNVar2);
      plVar8 = local_1e0;
      egl_00 = (Library *)CONCAT44(extraout_var_00,iVar5);
      if (bVar1 == false) {
        platformExt = (char *)(pNVar2->m_platformExtension)._M_string_length;
        if (platformExt != (char *)0x0) {
          platformExt = (pNVar2->m_platformExtension)._M_dataplus._M_p;
        }
        checkEGLPlatformSupport(egl_00,platformExt);
        plVar8 = local_1e0;
        uVar7 = (**(code **)(*local_1e0 + 0x18))(local_1e0);
        iVar5 = (*egl_00->_vptr_Library[0xf])(egl_00,display,local_1d0,uVar7,0);
        surface_00 = (EGLSurface)CONCAT44(extraout_var_02,iVar5);
        dVar4 = (*egl_00->_vptr_Library[0x1f])(egl_00);
        eglu::checkError(dVar4,"eglCreatePlatformWindowSurfaceEXT() failed",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
                         ,0x50);
      }
      else {
        uVar7 = (**(code **)(*local_1e0 + 0x10))(local_1e0);
        iVar5 = (*egl_00->_vptr_Library[0x12])(egl_00,display,local_1d0,uVar7,0);
        surface_00 = (EGLSurface)CONCAT44(extraout_var_01,iVar5);
        dVar4 = (*egl_00->_vptr_Library[0x1f])(egl_00);
        eglu::checkError(dVar4,"eglCreateWindowSurface() failed",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
                         ,0x49);
      }
      eglu::UniqueSurface::UniqueSurface(&local_1c8,egl,display,surface_00);
      local_1e4 = 0;
      local_1e8 = 0;
      (*egl->_vptr_Library[0x2b])(egl,display,local_1c8.m_surface,0x3057);
      dVar4 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar4,"querySurface(display, *surface, EGL_WIDTH, &windowWidth)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
                       ,0x94);
      (*egl->_vptr_Library[0x2b])(egl,display,local_1c8.m_surface,0x3056,&local_1e8);
      dVar4 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar4,"querySurface(display, *surface, EGL_HEIGHT, &windowHeight)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
                       ,0x95);
      if ((local_1e4 < 1) || (local_1e8 < 1)) {
        local_1b0 = (undefined1  [8])local_1d8;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"  Fail, invalid surface size ",0x1d);
        std::ostream::operator<<((ostringstream *)&local_1a8,local_1e4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"x",1);
        std::ostream::operator<<((ostringstream *)&local_1a8,local_1e8);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        tcu::TestContext::setTestResult
                  ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_FAIL,"Invalid surface size");
      }
      else {
        local_1b0 = (undefined1  [8])local_1d8;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"  Pass",6);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      eglu::UniqueSurface::~UniqueSurface(&local_1c8);
      (**(code **)(*plVar8 + 8))(plVar8);
      return;
    }
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Native window doesn\'t support legacy eglCreateWindowSurface()",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
               ,0x80);
  }
  else {
    if ((pNVar6->m_capabilities & CAPABILITY_CREATE_SURFACE_PLATFORM) != 0) goto LAB_00e5dcf6;
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Native window doesn\'t support eglCreatePlatformWindowSurfaceEXT()",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
               ,0x85);
  }
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void executeForConfig (EGLDisplay display, EGLConfig config)
	{
		const Library&						egl				= m_eglTestCtx.getLibrary();
		TestLog&							log				= m_testCtx.getLog();
		EGLint								id				= eglu::getConfigID(egl, display, config);
		const eglu::NativeWindowFactory&	windowFactory	= eglu::selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

		// \todo [2011-03-23 pyry] Iterate thru all possible combinations of EGL_RENDER_BUFFER, EGL_VG_COLORSPACE and EGL_VG_ALPHA_FORMAT

		if (m_useLegacyCreate)
		{
			if ((windowFactory.getCapabilities() & eglu::NativeWindow::CAPABILITY_CREATE_SURFACE_LEGACY) == 0)
				TCU_THROW(NotSupportedError, "Native window doesn't support legacy eglCreateWindowSurface()");
		}
		else
		{
			if ((windowFactory.getCapabilities() & eglu::NativeWindow::CAPABILITY_CREATE_SURFACE_PLATFORM) == 0)
				TCU_THROW(NotSupportedError, "Native window doesn't support eglCreatePlatformWindowSurfaceEXT()");
		}

		log << TestLog::Message << "Creating window surface with config ID " << id << TestLog::EndMessage;
		EGLU_CHECK_MSG(egl, "init");

		{
			const int							width			= 64;
			const int							height			= 64;
			de::UniquePtr<eglu::NativeWindow>	window			(windowFactory.createWindow(&m_eglTestCtx.getNativeDisplay(), display, config, DE_NULL, eglu::WindowParams(width, height, eglu::parseWindowVisibility(m_testCtx.getCommandLine()))));
			eglu::UniqueSurface					surface			(egl, display, createWindowSurface(display, config, m_eglTestCtx.getNativeDisplay(), *window, m_useLegacyCreate));

			EGLint								windowWidth		= 0;
			EGLint								windowHeight	= 0;

			EGLU_CHECK_CALL(egl, querySurface(display, *surface, EGL_WIDTH,		&windowWidth));
			EGLU_CHECK_CALL(egl, querySurface(display, *surface, EGL_HEIGHT,	&windowHeight));

			if (windowWidth <= 0 || windowHeight <= 0)
			{
				log << TestLog::Message << "  Fail, invalid surface size " << windowWidth << "x" << windowHeight << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid surface size");
			}
			else
				log << TestLog::Message << "  Pass" << TestLog::EndMessage;
		}
	}